

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O0

void __thiscall
CorUnix::CSharedMemoryObject::PromoteSharedData
          (CSharedMemoryObject *this,SHMPTR shmObjData,SHMObjData *psmod)

{
  void *pvVar1;
  PalObjectTypeId PVar2;
  DWORD DVar3;
  LPVOID pvVar4;
  void *pvSharedData;
  void *pvImmutableData;
  SHMObjData *psmod_local;
  SHMPTR shmObjData_local;
  CSharedMemoryObject *this_local;
  
  if (shmObjData == 0) {
    fprintf(_stderr,"] %s %s:%d","PromoteSharedData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x1d3);
    fprintf(_stderr,"Expression: SHMNULL != shmObjData\n");
  }
  if (psmod == (SHMObjData *)0x0) {
    fprintf(_stderr,"] %s %s:%d","PromoteSharedData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x1d4);
    fprintf(_stderr,"Expression: NULL != psmod\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  psmod->lProcessRefCount = 1;
  PVar2 = CObjectType::GetId((this->super_CPalObjectBase).m_pot);
  psmod->eTypeId = PVar2;
  DVar3 = CObjectType::GetImmutableDataSize((this->super_CPalObjectBase).m_pot);
  if (DVar3 != 0) {
    pvVar4 = SHMPtrToPtr(psmod->shmObjImmutableData);
    if (pvVar4 == (LPVOID)0x0) {
      fprintf(_stderr,"] %s %s:%d","PromoteSharedData",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
              ,0x1ea);
      fprintf(_stderr,"Expression: NULL != pvImmutableData\n");
    }
    pvVar1 = (this->super_CPalObjectBase).m_pvImmutableData;
    DVar3 = CObjectType::GetImmutableDataSize((this->super_CPalObjectBase).m_pot);
    memcpy(pvVar4,pvVar1,(ulong)DVar3);
  }
  DVar3 = CObjectType::GetSharedDataSize((this->super_CPalObjectBase).m_pot);
  if (DVar3 != 0) {
    pvVar4 = SHMPtrToPtr(psmod->shmObjSharedData);
    if (pvVar4 == (LPVOID)0x0) {
      fprintf(_stderr,"] %s %s:%d","PromoteSharedData",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
              ,0x1f8);
      fprintf(_stderr,"Expression: NULL != pvSharedData\n");
    }
    pvVar1 = this->m_pvSharedData;
    DVar3 = CObjectType::GetSharedDataSize((this->super_CPalObjectBase).m_pot);
    memcpy(pvVar4,pvVar1,(ulong)DVar3);
    InternalFree(this->m_pvSharedData);
    this->m_pvSharedData = pvVar4;
  }
  this->m_shmod = shmObjData;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return;
}

Assistant:

void
CSharedMemoryObject::PromoteSharedData(
    SHMPTR shmObjData,
    SHMObjData *psmod
    )
{
    _ASSERTE(SHMNULL != shmObjData);
    _ASSERTE(NULL != psmod);
    
    ENTRY("CSharedMemoryObject::PromoteSharedData"
        "(this = %p, shmObjData = %p, psmod = %p)\n",
        this, 
        shmObjData,
        psmod);
    
    //
    // psmod has been zero-inited, so we don't need to worry about
    // shmPrevObj, shmNextObj, fAddedToList, shmObjName, dwNameLength,
    // or pvSynchData
    //
    
    psmod->lProcessRefCount = 1;
    psmod->eTypeId = m_pot->GetId();
    
    if (0 != m_pot->GetImmutableDataSize())
    {
        void *pvImmutableData;

        pvImmutableData = SHMPTR_TO_TYPED_PTR(void, psmod->shmObjImmutableData);
        _ASSERTE(NULL != pvImmutableData);

        CopyMemory(
            pvImmutableData,
            m_pvImmutableData,
            m_pot->GetImmutableDataSize()
            );
    }

    if (0 != m_pot->GetSharedDataSize())
    {
        void *pvSharedData;

        pvSharedData = SHMPTR_TO_TYPED_PTR(void, psmod->shmObjSharedData);
        _ASSERTE(NULL != pvSharedData);

        CopyMemory(
            pvSharedData,
            m_pvSharedData,
            m_pot->GetSharedDataSize()
            );
        
        InternalFree(m_pvSharedData);
        m_pvSharedData = pvSharedData;
    }

    m_shmod = shmObjData;

    LOGEXIT("CSharedMemoryObject::PromoteSharedData\n");
}